

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSocketServerTests::TestsocketServerFixtureblock::RunImpl(TestsocketServerFixtureblock *this)

{
  socketServerFixtureblockHelper fixtureHelper;
  socketServerFixtureblockHelper local_1c0 [6];
  
  local_1c0[0].m_details = &(this->super_Test).m_details;
  local_1c0[0].super_socketServerFixture.bufLen = 0;
  local_1c0[0].super_socketServerFixture.connect = 0;
  local_1c0[0].super_socketServerFixture.write = 0;
  local_1c0[0].super_socketServerFixture.data = 0;
  local_1c0[0].super_socketServerFixture.disconnect = 0;
  local_1c0[0].super_socketServerFixture.connectSocket = 0;
  local_1c0[0].super_socketServerFixture.writeSocket = 0;
  local_1c0[0].super_socketServerFixture.dataSocket = 0;
  local_1c0[0].super_socketServerFixture.disconnectSocket = 0;
  local_1c0[0].super_socketServerFixture.super_Strategy._vptr_Strategy =
       (_func_int **)&PTR__Strategy_0032ea08;
  UnitTest::ExecuteTest<SuiteSocketServerTests::socketServerFixtureblockHelper>
            (local_1c0,local_1c0[0].m_details);
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, block)
{
  SocketServer object( 0 );
  object.add( TestSettings::port, true, true );
  socket_handle clientS = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS >= 0 );

  object.block( *this );
  CHECK_EQUAL( 1, connect );
  CHECK( connectSocket > 0 );

  send( clientS, "1", 1, 0 );
  object.block( *this );
  object.block( *this );
  CHECK_EQUAL( 1, data );
  CHECK_EQUAL( 1U, bufLen );
  CHECK_EQUAL( '1', *buf );
  CHECK( dataSocket > 0 );

  destroySocket( clientS );
  object.block( *this );
  CHECK_EQUAL( 1, disconnect );
  CHECK( disconnectSocket > 0 );
}